

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O3

void __thiscall
Map<Callback::Emitter_*,_List<Callback::Listener::Signal>_>::~Map
          (Map<Callback::Emitter_*,_List<Callback::Listener::Signal>_> *this)

{
  ItemBlock *pIVar1;
  ItemBlock *pIVar2;
  ItemBlock *pIVar3;
  ItemBlock *pIVar4;
  Item *pIVar5;
  
  for (pIVar5 = (this->_begin).item; pIVar5 != &this->endItem; pIVar5 = pIVar5->next) {
    pIVar1 = (pIVar5->value).blocks;
    while (pIVar1 != (ItemBlock *)0x0) {
      pIVar2 = pIVar1->next;
      operator_delete__(pIVar1);
      pIVar1 = pIVar2;
    }
  }
  pIVar4 = this->blocks;
  while (pIVar4 != (ItemBlock *)0x0) {
    pIVar3 = pIVar4->next;
    operator_delete__(pIVar4);
    pIVar4 = pIVar3;
  }
  pIVar1 = (this->endItem).value.blocks;
  while (pIVar1 != (ItemBlock *)0x0) {
    pIVar2 = pIVar1->next;
    operator_delete__(pIVar1);
    pIVar1 = pIVar2;
  }
  return;
}

Assistant:

~Map()
  {
    for(Item* i = _begin.item, * end = &endItem; i != end; i = i->next)
      i->~Item();
    for(ItemBlock* i = blocks, * next; i; i = next)
    {
      next = i->next;
      delete[] (char*)i;
    }
  }